

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O3

void __thiscall helics::apps::Recorder::writeTextFile(Recorder *this,string *filename)

{
  pointer pVVar1;
  pointer pVVar2;
  Time TVar3;
  byte *pbVar4;
  bool bVar5;
  int iVar6;
  difference_type __node_offset_1;
  ostream *poVar7;
  string *psVar8;
  _Elt_pointer pIVar9;
  ulong uVar10;
  difference_type __node_offset;
  long lVar11;
  pointer puVar12;
  undefined8 uVar13;
  Input *this_00;
  Message *pMVar14;
  _Alloc_hider _Var15;
  string *val;
  double dVar16;
  string_view str2encode;
  json V;
  ofstream outFile;
  string_t local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  pointer local_248;
  data local_240;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  if (filename->_M_string_length == 0) {
    filename = &(this->super_App).outFileName;
  }
  std::ofstream::ofstream(&local_230,(string *)filename,_S_out);
  if ((this->points).
      super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->points).
      super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"#time \ttag\t type*\t value\n",0x19);
    pVVar1 = (this->points).
             super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar2 = (this->points).
             super__Vector_base<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pVVar1 != pVVar2) {
      do {
        val = &pVVar1->value;
        if (*(char *)((long)(val + -1) + 0x1e) == '\x01') {
          poVar7 = std::ostream::_M_insert<double>
                             ((double)(*(long *)((long)(val + -1) + 0x10) % 1000000000) * 1e-09 +
                              (double)(*(long *)((long)(val + -1) + 0x10) / 1000000000));
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t",2);
          pIVar9 = (this->subscriptions).
                   super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur;
          lVar11 = ((long)pIVar9 -
                    (long)(this->subscriptions).
                          super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 4) * -0x79435e50d79435e5 +
                   (long)*(int *)((long)(val + -1) + 0x18);
          if (lVar11 == 0) {
            pIVar9 = pIVar9 + *(int *)((long)(val + -1) + 0x18);
          }
          else {
            pIVar9 = (this->subscriptions).
                     super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                     super__Deque_impl_data._M_start._M_node[lVar11];
          }
          if ((pIVar9->givenTarget)._M_string_length == 0) {
            psVar8 = Interface::getSourceTargets_abi_cxx11_(&pIVar9->super_Interface);
          }
          else {
            psVar8 = &pIVar9->givenTarget;
          }
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
          local_288._M_dataplus._M_p._0_1_ = 9;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_288,1);
          pIVar9 = (this->subscriptions).
                   super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur;
          lVar11 = ((long)pIVar9 -
                    (long)(this->subscriptions).
                          super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 4) * -0x79435e50d79435e5 +
                   (long)*(int *)((long)(val + -1) + 0x18);
          if (lVar11 == 0) {
            this_00 = pIVar9 + *(int *)((long)(val + -1) + 0x18);
          }
          else {
            this_00 = (this->subscriptions).
                      super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[lVar11];
          }
          psVar8 = Input::getPublicationType_abi_cxx11_(this_00);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
          local_288._M_dataplus._M_p._0_1_ = 9;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_288,1);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump(&local_288,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_268,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_268);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)CONCAT71(local_288._M_dataplus._M_p._1_7_,
                                                      local_288._M_dataplus._M_p._0_1_),
                              local_288._M_string_length);
          local_268._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_268,1);
        }
        else {
          dVar16 = (double)(*(long *)((long)(val + -1) + 0x10) % 1000000000) * 1e-09 +
                   (double)(*(long *)((long)(val + -1) + 0x10) / 1000000000);
          if (*(short *)((long)(val + -1) + 0x1c) < 1) {
            poVar7 = std::ostream::_M_insert<double>(dVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t",2);
            pIVar9 = (this->subscriptions).
                     super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur;
            lVar11 = ((long)pIVar9 -
                      (long)(this->subscriptions).
                            super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl
                            .super__Deque_impl_data._M_start._M_first >> 4) * -0x79435e50d79435e5 +
                     (long)*(int *)((long)(val + -1) + 0x18);
            if (lVar11 == 0) {
              pIVar9 = pIVar9 + *(int *)((long)(val + -1) + 0x18);
            }
            else {
              pIVar9 = (this->subscriptions).
                       super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node[lVar11];
            }
            if ((pIVar9->givenTarget)._M_string_length == 0) {
              psVar8 = Interface::getSourceTargets_abi_cxx11_(&pIVar9->super_Interface);
            }
            else {
              psVar8 = &pIVar9->givenTarget;
            }
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
            local_288._M_dataplus._M_p._0_1_ = 9;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_288,1)
            ;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::dump(&local_288,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_268,-1,' ',true,hex);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&local_268);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)CONCAT71(local_288._M_dataplus._M_p._1_7_,
                                                        local_288._M_dataplus._M_p._0_1_),
                                local_288._M_string_length);
            local_268._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_268,1);
          }
          else {
            poVar7 = std::ostream::_M_insert<double>(dVar16);
            local_288._M_dataplus._M_p._0_1_ = 0x3a;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_288,1)
            ;
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(short *)((long)(val + -1) + 0x1c))
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t\t",2);
            pIVar9 = (this->subscriptions).
                     super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur;
            lVar11 = ((long)pIVar9 -
                      (long)(this->subscriptions).
                            super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl
                            .super__Deque_impl_data._M_start._M_first >> 4) * -0x79435e50d79435e5 +
                     (long)*(int *)((long)(val + -1) + 0x18);
            if (lVar11 == 0) {
              pIVar9 = pIVar9 + *(int *)((long)(val + -1) + 0x18);
            }
            else {
              pIVar9 = (this->subscriptions).
                       super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                       super__Deque_impl_data._M_start._M_node[lVar11];
            }
            if ((pIVar9->givenTarget)._M_string_length == 0) {
              psVar8 = Interface::getSourceTargets_abi_cxx11_(&pIVar9->super_Interface);
            }
            else {
              psVar8 = &pIVar9->givenTarget;
            }
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
            local_288._M_dataplus._M_p._0_1_ = 9;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_288,1)
            ;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::dump(&local_288,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_268,-1,' ',true,hex);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&local_268);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)CONCAT71(local_288._M_dataplus._M_p._1_7_,
                                                        local_288._M_dataplus._M_p._0_1_),
                                local_288._M_string_length);
            local_268._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_268,1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_288._M_dataplus._M_p._1_7_,local_288._M_dataplus._M_p._0_1_) !=
            &local_288.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_288._M_dataplus._M_p._1_7_,local_288._M_dataplus._M_p._0_1_
                                  ),local_288.field_2._M_allocated_capacity + 1);
        }
        pVVar1 = (pointer)(val + 1);
      } while ((pointer)(val + 1) != pVVar2);
    }
  }
  if ((this->messages).
      super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->messages).
      super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# m\t time \tsource\t dest\t message\n",0x21);
    puVar12 = (this->messages).
              super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_248 = (this->messages).
                super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar12 != local_248) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"m\t",2);
        TVar3.internalTimeCode =
             (((puVar12->_M_t).
               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
               super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->time).internalTimeCode
        ;
        poVar7 = std::ostream::_M_insert<double>
                           ((double)(TVar3.internalTimeCode % 1000000000) * 1e-09 +
                            (double)(TVar3.internalTimeCode / 1000000000));
        local_288._M_dataplus._M_p._0_1_ = 9;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_288,1);
        pMVar14 = (puVar12->_M_t).
                  super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t
                  .super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(pMVar14->source)._M_dataplus._M_p,
                            (pMVar14->source)._M_string_length);
        local_288._M_dataplus._M_p._0_1_ = 9;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_288,1);
        pMVar14 = (puVar12->_M_t).
                  super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t
                  .super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        uVar10 = (pMVar14->dest)._M_string_length;
        if (uVar10 < 7) {
LAB_00280801:
          psVar8 = &pMVar14->dest;
        }
        else {
          iVar6 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pMVar14->dest,uVar10 - 6,6,"cloneE");
          pMVar14 = (puVar12->_M_t).
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
          if (iVar6 != 0) {
            uVar10 = (pMVar14->dest)._M_string_length;
            goto LAB_00280801;
          }
          uVar10 = (pMVar14->original_dest)._M_string_length;
          psVar8 = &pMVar14->original_dest;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,(psVar8->_M_dataplus)._M_p,uVar10);
        bVar5 = isBinaryData(&((puVar12->_M_t).
                               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                               .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->data)
        ;
        if (bVar5) {
          bVar5 = isEscapableData(&((puVar12->_M_t).
                                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->
                                   data);
          if (bVar5) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            pMVar14 = (puVar12->_M_t).
                      super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                      .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
            pbVar4 = (pMVar14->data).heap;
            local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_268,pbVar4,pbVar4 + (pMVar14->data).bufferSize);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_240,&local_268);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::dump(&local_288,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_240,-1,' ',true,hex);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_240);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_230,
                                (char *)CONCAT71(local_288._M_dataplus._M_p._1_7_,
                                                 local_288._M_dataplus._M_p._0_1_),
                                local_288._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_288._M_dataplus._M_p._1_7_,local_288._M_dataplus._M_p._0_1_) !=
                &local_288.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_288._M_dataplus._M_p._1_7_,
                                       local_288._M_dataplus._M_p._0_1_),
                              local_288.field_2._M_allocated_capacity + 1);
            }
            uVar13 = local_268.field_2._M_allocated_capacity;
            _Var15._M_p = local_268._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
LAB_002809a6:
              operator_delete(_Var15._M_p,uVar13 + 1);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t\"",2);
            pMVar14 = (puVar12->_M_t).
                      super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                      .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
            str2encode._M_str = (char *)(pMVar14->data).heap;
            str2encode._M_len = (pMVar14->data).bufferSize;
            encode_abi_cxx11_((string *)&local_288,str2encode);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_230,
                                (char *)CONCAT71(local_288._M_dataplus._M_p._1_7_,
                                                 local_288._M_dataplus._M_p._0_1_),
                                local_288._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
            uVar13 = local_288.field_2._M_allocated_capacity;
            _Var15._M_p = (pointer)CONCAT71(local_288._M_dataplus._M_p._1_7_,
                                            local_288._M_dataplus._M_p._0_1_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_288._M_dataplus._M_p._1_7_,local_288._M_dataplus._M_p._0_1_) !=
                &local_288.field_2) goto LAB_002809a6;
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t\"",2);
          pMVar14 = (puVar12->_M_t).
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,(char *)(pMVar14->data).heap,
                              (pMVar14->data).bufferSize);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
        }
        puVar12 = puVar12 + 1;
      } while (puVar12 != local_248);
    }
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _pthread_mutex_unlock;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Recorder::writeTextFile(const std::string& filename)
{
    std::ofstream outFile(filename.empty() ? outFileName : filename);
    if (!points.empty()) {
        outFile << "#time \ttag\t type*\t value\n";
    }
    for (auto& point : points) {
        if (point.first) {
            outFile << static_cast<double>(point.time) << "\t\t"
                    << subscriptions[point.index].getTarget() << '\t'
                    << subscriptions[point.index].getPublicationType() << '\t'
                    << generateJsonQuotedString(point.value) << '\n';
        } else {
            if (point.iteration > 0) {
                outFile << static_cast<double>(point.time) << ':' << point.iteration << "\t\t"
                        << subscriptions[point.index].getTarget() << '\t'
                        << generateJsonQuotedString(point.value) << '\n';
            } else {
                outFile << static_cast<double>(point.time) << "\t\t"
                        << subscriptions[point.index].getTarget() << '\t'
                        << generateJsonQuotedString(point.value) << '\n';
            }
        }
    }
    if (!messages.empty()) {
        outFile << "# m\t time \tsource\t dest\t message\n";
    }
    for (auto& mess : messages) {
        outFile << "m\t" << static_cast<double>(mess->time) << '\t' << mess->source << '\t';
        if ((mess->dest.size() < 7) ||
            (mess->dest.compare(mess->dest.size() - 6, 6, "cloneE") != 0)) {
            outFile << mess->dest;
        } else {
            outFile << mess->original_dest;
        }
        if (isBinaryData(mess->data)) {
            if (isEscapableData(mess->data)) {
                outFile << "\t" << generateJsonQuotedString(std::string(mess->data.to_string()))
                        << "\n";
            } else {
                outFile << "\t\"" << encode(mess->data.to_string()) << "\"\n";
            }

        } else {
            outFile << "\t\"" << mess->data.to_string() << "\"\n";
        }
    }
}